

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

UBool rbbi_cleanup(void)

{
  if (gLanguageBreakFactories != (UStack *)0x0) {
    (*(gLanguageBreakFactories->super_UVector).super_UObject._vptr_UObject[1])();
  }
  gLanguageBreakFactories = (UStack *)0x0;
  if (gEmptyString != (UnicodeString *)0x0) {
    (*(gEmptyString->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  gEmptyString = (UnicodeString *)0x0;
  LOCK();
  gLanguageBreakFactoriesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LOCK();
  gRBBIInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV rbbi_cleanup(void) {
    delete gLanguageBreakFactories;
    gLanguageBreakFactories = nullptr;
    delete gEmptyString;
    gEmptyString = nullptr;
    gLanguageBreakFactoriesInitOnce.reset();
    gRBBIInitOnce.reset();
    return TRUE;
}